

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_get_token2(char **ptr,char *delimiter,char **token,int *isanumber,int *status)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  char *loc;
  char tval [73];
  byte *local_90;
  char local_88 [72];
  undefined1 local_40;
  
  iVar5 = 0;
  if (*status == 0) {
    pcVar6 = *ptr;
    cVar1 = *pcVar6;
    while (cVar1 == ' ') {
      pcVar6 = pcVar6 + 1;
      *ptr = pcVar6;
      cVar1 = *pcVar6;
    }
    sVar2 = strcspn(pcVar6,delimiter);
    iVar5 = (int)sVar2;
    if (iVar5 != 0) {
      pcVar6 = (char *)calloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20,1);
      *token = pcVar6;
      if (pcVar6 == (char *)0x0) {
        ffpmsg("Couldn\'t allocate memory to hold token string (fits_get_token2).");
        *status = 0x71;
        iVar5 = 0;
      }
      else {
        pcVar3 = *ptr;
        sVar2 = (long)(sVar2 << 0x20) >> 0x20;
        strncat(pcVar6,pcVar3,sVar2);
        *ptr = pcVar3 + sVar2;
        if (isanumber != (int *)0x0) {
          *isanumber = 1;
          pcVar6 = *token;
          pcVar3 = strchr(pcVar6,0x44);
          if (pcVar3 != (char *)0x0) {
            strncpy(local_88,pcVar6,0x48);
            local_40 = 0;
            local_90 = (byte *)strchr(local_88,0x44);
            if (local_90 != (byte *)0x0) {
              *local_90 = 0x45;
            }
            pcVar6 = local_88;
          }
          strtod(pcVar6,(char **)&local_90);
          if ((*local_90 & 0xdf) != 0) {
            *isanumber = 0;
          }
          piVar4 = __errno_location();
          if (*piVar4 == 0x22) {
            *isanumber = 0;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int fits_get_token2(char **ptr, 
                   char *delimiter,
                   char **token,
                   int *isanumber,  /* O - is this token a number? */
		   int *status)

/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;

   This routine allocates the *token string;  the calling routine must free it 
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    if (*status)
        return(0);
	
    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
	*token = (char *) calloc(slen + 1, 1); 
	if (!(*token)) {
          ffpmsg("Couldn't allocate memory to hold token string (fits_get_token2).");
          *status = MEMORY_ALLOCATION ;
	  return(0);
        }
 
        strncat(*token, *ptr, slen);       /* copy token */
        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(*token, 'D'))  {
	        strncpy(tval, *token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(*token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}